

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  CleanupNode *pCVar1;
  CleanupNode *this_00;
  
  this->_vptr_Iterator = (_func_int **)&PTR__Iterator_00171960;
  if ((this->cleanup_head_).function != (CleanupFunction)0x0) {
    CleanupNode::Run(&this->cleanup_head_);
    this_00 = (this->cleanup_head_).next;
    while (this_00 != (CleanupNode *)0x0) {
      CleanupNode::Run(this_00);
      pCVar1 = this_00->next;
      operator_delete(this_00);
      this_00 = pCVar1;
    }
  }
  return;
}

Assistant:

Iterator::~Iterator() {
  if (!cleanup_head_.IsEmpty()) {
    cleanup_head_.Run();
    for (CleanupNode* node = cleanup_head_.next; node != nullptr;) {
      node->Run();
      CleanupNode* next_node = node->next;
      delete node;
      node = next_node;
    }
  }
}